

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *
__thiscall
Assimp::FBX::Document::GetConnectionsSequenced
          (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *__return_storage_ptr__,Document *this,uint64_t id,ConnectionMap *conns)

{
  _Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const> __comp;
  bool bVar1;
  size_type __n;
  reference ppVar2;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  pVar3;
  offset_in_Connection_to_subr in_stack_ffffffffffffff38;
  _Self local_68;
  const_iterator it;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  range;
  ConnectionMap *conns_local;
  uint64_t id_local;
  Document *this_local;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *temp;
  
  range.second._M_node._7_1_ = 0;
  conns_local = (ConnectionMap *)id;
  id_local = (uint64_t)this;
  this_local = (Document *)__return_storage_ptr__;
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  vector(__return_storage_ptr__);
  pVar3 = std::
          multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
          ::equal_range(conns,(key_type_conflict2 *)&conns_local);
  it._M_node = (_Base_ptr)pVar3.second._M_node;
  range.first._M_node = it._M_node;
  __n = std::
        distance<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                  (pVar3.first._M_node,
                   (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
                    )it._M_node);
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  reserve(__return_storage_ptr__,__n);
  local_68._M_node = pVar3.first._M_node._M_node;
  while (bVar1 = std::operator!=(&local_68,&range.first), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
             ::operator*(&local_68);
    std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
    push_back(__return_storage_ptr__,&ppVar2->second);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>::
    operator++(&local_68);
  }
  __first = std::
            vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ::begin(__return_storage_ptr__);
  __last = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::end(__return_storage_ptr__);
  std::mem_fn<bool(Assimp::FBX::Connection_const*)const,Assimp::FBX::Connection>
            ((_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const> *)
             Connection::Compare,0);
  __comp.
  super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
  ._8_8_ = __n;
  __comp.
  super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
  ._M_pmf = in_stack_ffffffffffffff38;
  std::
  sort<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>
            ((__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              )__last._M_current,__comp);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Connection*> Document::GetConnectionsSequenced(uint64_t id, const ConnectionMap& conns) const
{
    std::vector<const Connection*> temp;

    const std::pair<ConnectionMap::const_iterator,ConnectionMap::const_iterator> range =
        conns.equal_range(id);

    temp.reserve(std::distance(range.first,range.second));
    for (ConnectionMap::const_iterator it = range.first; it != range.second; ++it) {
        temp.push_back((*it).second);
    }

    std::sort(temp.begin(), temp.end(), std::mem_fn(&Connection::Compare));

    return temp; // NRVO should handle this
}